

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

void __thiscall pg::PPSolver::printState(PPSolver *this)

{
  uint uVar1;
  int *piVar2;
  Game *pGVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ostream *poVar9;
  uint uVar10;
  int *curedge;
  int *piVar11;
  int *piVar12;
  int iVar13;
  char *pcVar14;
  int *curedge_1;
  long lVar15;
  bool bVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  vector<int,_std::allocator<int>_> exits;
  
  uVar10 = (uint)((this->super_Solver).game)->n_vertices;
  do {
    do {
      uVar10 = uVar10 - 1;
      if ((int)uVar10 < 0) {
        return;
      }
      uVar1 = this->region[uVar10 & 0x7fffffff];
      lVar15 = (long)(int)uVar1;
    } while ((lVar15 == -2) ||
            (uVar1 != ((this->super_Solver).game)->_priority[uVar10 & 0x7fffffff]));
    poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1;34m|| \x1b[1;37m");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar1);
    std::operator<<(poVar9,"\x1b[m (");
    exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    piVar2 = this->regions[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar17 = this->regions[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar17 != piVar2; piVar17 = piVar17 + 1) {
      iVar13 = *piVar17;
      poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1m");
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[iVar13]);
      std::operator<<(poVar9,"\x1b[m ");
      uVar7 = Solver::owner(&this->super_Solver,iVar13);
      pGVar3 = (this->super_Solver).game;
      piVar12 = pGVar3->_outedges + pGVar3->_firstouts[iVar13];
      if (uVar7 == (uVar1 & 1)) {
        bVar4 = true;
        for (piVar11 = piVar12; (long)*piVar11 != -1; piVar11 = piVar11 + 1) {
          uVar7 = this->region[*piVar11];
          iVar13 = 7;
          if (uVar7 != uVar1) {
            iVar13 = 0;
          }
          if (uVar7 == 0xfffffffe) {
            iVar13 = 9;
          }
          bVar4 = (bool)(bVar4 & (uVar7 == 0xfffffffe || uVar7 != uVar1));
          if ((iVar13 != 9) && (iVar13 != 0)) break;
        }
        if (bVar4) {
          for (; lVar19 = (long)*piVar12, lVar19 != -1; piVar12 = piVar12 + 1) {
            if (this->region[lVar19] != -2) {
              poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[m");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->region[lVar19]);
              std::operator<<(poVar9,"\x1b[m ");
              if (this->region[lVar19] != uVar1) {
                std::vector<int,_std::allocator<int>_>::push_back(&exits,this->region + lVar19);
              }
            }
          }
        }
      }
      else {
        for (; lVar19 = (long)*piVar12, lVar19 != -1; piVar12 = piVar12 + 1) {
          if (this->region[lVar19] != -2) {
            poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[m");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->region[lVar19]);
            std::operator<<(poVar9,"\x1b[m ");
            if (this->region[lVar19] != uVar1) {
              std::vector<int,_std::allocator<int>_>::push_back(&exits,this->region + lVar19);
            }
          }
        }
      }
    }
    if (this->regions[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        this->regions[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator<<((this->super_Solver).logger,"\b");
    }
    std::operator<<((this->super_Solver).logger,") => {");
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    for (uVar7 = 0; uVar18 = (ulong)uVar7,
        uVar18 < (ulong)((long)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      if (uVar18 == 0) {
LAB_00149eaf:
        std::ostream::operator<<
                  ((this->super_Solver).logger,
                   exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18]);
      }
      else if (exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar7 - 1] !=
               exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar18]) {
        std::operator<<((this->super_Solver).logger,", ");
        goto LAB_00149eaf;
      }
    }
    std::operator<<((this->super_Solver).logger,"}");
    piVar17 = this->regions[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar2 = this->regions[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar16 = true;
    bVar5 = true;
    bVar4 = true;
    bVar6 = true;
    do {
      if (piVar17 == piVar2) {
        if (bVar6) goto LAB_00149ffa;
        break;
      }
      iVar13 = *piVar17;
      iVar8 = Solver::owner(&this->super_Solver,iVar13);
      pGVar3 = (this->super_Solver).game;
      piVar12 = pGVar3->_outedges + pGVar3->_firstouts[iVar13];
      if (iVar8 == (int)uVar1 % 2) {
        bVar6 = false;
        do {
          if ((long)*piVar12 == -1) goto LAB_00149f59;
          if (this->region[*piVar12] == uVar1) {
            bVar6 = true;
          }
          piVar12 = piVar12 + 1;
        } while (!bVar6);
        bVar6 = true;
LAB_00149f59:
        bVar16 = (bool)(bVar16 & bVar6);
        bVar4 = bVar5;
        if (!bVar6) {
          bVar4 = false;
          bVar5 = false;
        }
      }
      else {
        for (; (long)*piVar12 != -1; piVar12 = piVar12 + 1) {
          uVar7 = this->region[*piVar12];
          if (uVar7 != 0xfffffffe) {
            bVar4 = bVar5;
            if ((int)uVar7 < (int)uVar1) {
              bVar4 = false;
            }
            if (uVar7 == uVar1) {
              bVar4 = bVar5;
            }
            bVar16 = (bool)(bVar16 & uVar7 == uVar1);
            bVar5 = bVar4;
            if (!bVar4) break;
          }
        }
      }
      piVar17 = piVar17 + 1;
      bVar6 = false;
    } while (bVar4);
    if (bVar16) {
      poVar9 = (this->super_Solver).logger;
      pcVar14 = " (dominion)";
LAB_00149ff5:
      std::operator<<(poVar9,pcVar14);
    }
    else if (bVar4) {
      poVar9 = std::operator<<((this->super_Solver).logger," (closed to ");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (poVar9,*exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
      pcVar14 = ")";
      goto LAB_00149ff5;
    }
LAB_00149ffa:
    std::operator<<((this->super_Solver).logger,"\x1b[m");
    std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&exits.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

void
PPSolver::printState()
{
    for (int i = nodecount()-1; i>=0; i--) {
        if (region[i] == -2) continue;
        int p = priority(i);
        if (region[i] != p) continue;

        logger << "\033[1;34m|| \033[1;37m" << p << "\033[m (";

        std::vector<int> exits;
        for (int j : regions[p]) {
            logger << "\033[1m" << priority(j) << "\033[m ";
            if (owner(j) == (p&1)) {
                bool escapes = true;
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == -2) continue;
                    if (region[to] == p) {
                        escapes = false;
                        break;
                    }
                }
                if (escapes) {
                    for (auto curedge = outs(j); *curedge != -1; curedge++) {
                        int to = *curedge;
                        if (region[to] == -2) continue;
                        logger << "\033[m" << region[to] << "\033[m ";
                        if (region[to] != p) exits.push_back(region[to]);
                    }
                }
            } else {
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == -2) continue;
                    logger << "\033[m" << region[to] << "\033[m ";
                    if (region[to] != p) exits.push_back(region[to]);
                }
            }
        }

        if (!regions[p].empty()) logger << "\b";
        logger << ") => {";

        std::sort(exits.begin(), exits.end());
        for (unsigned k=0; k<exits.size(); k++) {
            if (k > 0) {
                if (exits[k-1] == exits[k]) continue;
                logger << ", ";
            }
            logger << exits[k];
        }
        logger << "}";

        // check if the region is closed
        bool fullclosed = true;
        bool subclosed = true;
        bool empty = true;
        for (int j : regions[p]) {
            empty = false;
            if (owner(j) == p%2) {
                // node won by escape owner
                // it is therefore closed if it has an edge to itself
                bool nodeclosed = false;
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == p) nodeclosed = true;
                    if (nodeclosed) break;
                }
                if (!nodeclosed) fullclosed = subclosed = false;
            } else {
                // region lost by escape owner
                // it is therefore closed if there are no edges to lower regions
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == -2) continue;
                    if (region[to] != p) {
                        fullclosed = false;
                        if (region[to] < p) subclosed = false;
                    }
                    if (!subclosed) break;
                }
            }
            if (!subclosed) break;
        }

        if (empty) {} 
        else if (fullclosed) logger << " (dominion)";
        else if (subclosed) logger << " (closed to " << exits[0] << ")";
        logger << "\033[m";
        logger << std::endl;
    }
}